

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckFrameSet(TidyDocImpl *doc,Node *node)

{
  Node *node_00;
  bool bVar1;
  Bool BVar2;
  ctmbstr ptVar3;
  char *pcVar4;
  ctmbstr word;
  Node *para;
  Node *pNStack_20;
  Bool HasNoFrames;
  Node *temp;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  BVar2 = Level1_Enabled(doc);
  if (BVar2 != no) {
    if ((doc->badAccess & 0x40) != 0) {
      prvTidyReportAccessError(doc,node,0x2de);
      doc->badAccess = doc->badAccess & 0xffffffbf;
    }
    for (pNStack_20 = node->content; pNStack_20 != (Node *)0x0; pNStack_20 = pNStack_20->next) {
      if (((pNStack_20 != (Node *)0x0) && (pNStack_20->tag != (Dict *)0x0)) &&
         (pNStack_20->tag->id == TidyTag_NOFRAMES)) {
        bVar1 = true;
        if (((pNStack_20->content == (Node *)0x0) || (pNStack_20->content->content == (Node *)0x0))
           || ((pNStack_20->content->content->tag == (Dict *)0x0 ||
               (pNStack_20->content->content->tag->id != TidyTag_P)))) {
          if (pNStack_20->content == (Node *)0x0) {
            prvTidyReportAccessError(doc,pNStack_20,0x2dc);
          }
          else if (pNStack_20->content != (Node *)0x0) {
            ptVar3 = textFromOneNode(doc,pNStack_20->content);
            BVar2 = IsWhitespace(ptVar3);
            if (BVar2 != no) {
              prvTidyReportAccessError(doc,pNStack_20,0x2dc);
            }
          }
        }
        else {
          node_00 = pNStack_20->content->content;
          BVar2 = prvTidynodeIsText(node_00->content);
          if (((BVar2 != no) &&
              (ptVar3 = textFromOneNode(doc,node_00->content), ptVar3 != (ctmbstr)0x0)) &&
             (pcVar4 = strstr(ptVar3,"browser"), pcVar4 != (char *)0x0)) {
            prvTidyReportAccessError(doc,node_00,0x2dd);
          }
        }
      }
    }
    if (!bVar1) {
      prvTidyReportAccessError(doc,node,0x2db);
    }
  }
  return;
}

Assistant:

static void CheckFrameSet( TidyDocImpl* doc, Node* node )
{
    Node* temp;
    Bool HasNoFrames = no;

    if (Level1_Enabled( doc ))
    {
        if ( doc->badAccess & BA_INVALID_LINK_NOFRAMES )
        {
           TY_(ReportAccessError)( doc, node, NOFRAMES_INVALID_LINK);
           doc->badAccess &= ~BA_INVALID_LINK_NOFRAMES; /* emit only once */
        }
        for ( temp = node->content; temp != NULL ; temp = temp->next )
        {
            if ( nodeIsNOFRAMES(temp) )
            {
                HasNoFrames = yes;

                if ( temp->content && nodeIsP(temp->content->content) )
                {
                    Node* para = temp->content->content;
                    if ( TY_(nodeIsText)(para->content) )
                    {
                        ctmbstr word = textFromOneNode( doc, para->content );
                        if ( word && strstr(word, "browser") != NULL )
                            TY_(ReportAccessError)( doc, para, NOFRAMES_INVALID_CONTENT );
                    }
                }
                else if (temp->content == NULL)
                    TY_(ReportAccessError)( doc, temp, NOFRAMES_INVALID_NO_VALUE);
                else if ( temp->content &&
                          IsWhitespace(textFromOneNode(doc, temp->content)) )
                    TY_(ReportAccessError)( doc, temp, NOFRAMES_INVALID_NO_VALUE);
            }
        }

        if (HasNoFrames == no)
            TY_(ReportAccessError)( doc, node, FRAME_MISSING_NOFRAMES);
    }
}